

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O0

void __thiscall
libtorrent::torrent_info::add_tracker(torrent_info *this,string *url,int tier,tracker_source source)

{
  string_view u;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  undefined1 local_a8 [8];
  announce_entry e;
  __normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
  local_28;
  __normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
  i;
  tracker_source source_local;
  int tier_local;
  string *url_local;
  torrent_info *this_local;
  
  i._M_current._0_4_ = source;
  i._M_current._4_4_ = tier;
  iVar2 = ::std::
          vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          ::begin(&(this->m_urls).
                   super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                 );
  iVar3 = ::std::
          vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          ::end(&(this->m_urls).
                 super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
               );
  local_28 = ::std::
             find_if<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__0>
                       (iVar2._M_current,iVar3._M_current,(anon_class_8_1_ba1d80cf_for__M_pred)url);
  e._88_8_ = ::std::
             vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
             ::end(&(this->m_urls).
                    super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                  );
  bVar1 = __gnu_cxx::operator!=
                    (&local_28,
                     (__normal_iterator<libtorrent::v1_2::announce_entry_*,_std::vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>_>
                      *)&e.tier);
  if (!bVar1) {
    u = (string_view)::std::__cxx11::string::operator_cast_to_basic_string_view((string *)url);
    v1_2::announce_entry::announce_entry((announce_entry *)local_a8,u);
    e.endpoints.
    super__Vector_base<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = i._M_current._4_1_;
    e.endpoints.
    super__Vector_base<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ =
         e.endpoints.
         super__Vector_base<libtorrent::v1_2::announce_endpoint,_std::allocator<libtorrent::v1_2::announce_endpoint>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 0xf0 | (byte)i._M_current & 0xf;
    ::std::
    vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>::
    push_back(&(this->m_urls).
               super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
              ,(announce_entry *)local_a8);
    iVar2 = ::std::
            vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
            ::begin(&(this->m_urls).
                     super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                   );
    iVar3 = ::std::
            vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
            ::end(&(this->m_urls).
                   super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                 );
    ::std::
    sort<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,libtorrent::torrent_info::add_tracker(std::__cxx11::string_const&,int,libtorrent::v1_2::announce_entry::tracker_source)::__1>
              (iVar2._M_current,iVar3._M_current);
    v1_2::announce_entry::~announce_entry((announce_entry *)local_a8);
  }
  return;
}

Assistant:

void torrent_info::add_tracker(std::string const& url, int const tier
		, announce_entry::tracker_source const source)
	{
		TORRENT_ASSERT_PRECOND(!url.empty());
		auto const i = std::find_if(m_urls.begin(), m_urls.end()
			, [&url](announce_entry const& ae) { return ae.url == url; });
		if (i != m_urls.end()) return;

		announce_entry e(url);
		e.tier = std::uint8_t(tier);
		e.source = source;
		m_urls.push_back(e);

		std::sort(m_urls.begin(), m_urls.end()
			, [] (announce_entry const& lhs, announce_entry const& rhs)
			{ return lhs.tier < rhs.tier; });
	}